

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O3

Matrix4f *
Matrix4f::orthographicProjection
          (Matrix4f *__return_storage_ptr__,float left,float right,float bottom,float top,
          float zNear,float zFar,bool directX)

{
  undefined3 in_register_00000031;
  Matrix4f *m;
  bool bVar1;
  float fVar2;
  float in_XMM0_Db;
  float in_XMM1_Db;
  float in_XMM2_Db;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float in_XMM3_Db;
  float fVar5;
  
  __return_storage_ptr__->m_elements[5] = 0.0;
  __return_storage_ptr__->m_elements[6] = 0.0;
  __return_storage_ptr__->m_elements[7] = 0.0;
  __return_storage_ptr__->m_elements[8] = 0.0;
  __return_storage_ptr__->m_elements[8] = 0.0;
  __return_storage_ptr__->m_elements[9] = 0.0;
  __return_storage_ptr__->m_elements[10] = 0.0;
  __return_storage_ptr__->m_elements[0xb] = 0.0;
  __return_storage_ptr__->m_elements[1] = 0.0;
  __return_storage_ptr__->m_elements[2] = 0.0;
  __return_storage_ptr__->m_elements[3] = 0.0;
  __return_storage_ptr__->m_elements[4] = 0.0;
  fVar5 = 2.0;
  __return_storage_ptr__->m_elements[0] = 2.0 / (right - left);
  __return_storage_ptr__->m_elements[5] = 2.0 / (top - bottom);
  __return_storage_ptr__->m_elements[0xf] = 1.0;
  auVar3._0_4_ = left + right;
  auVar3._4_4_ = bottom + top;
  auVar3._8_4_ = in_XMM0_Db + in_XMM1_Db;
  auVar3._12_4_ = in_XMM2_Db + in_XMM3_Db;
  auVar4._4_4_ = bottom - top;
  auVar4._0_4_ = left - right;
  auVar4._8_4_ = in_XMM0_Db - in_XMM1_Db;
  auVar4._12_4_ = in_XMM2_Db - in_XMM3_Db;
  auVar4 = divps(auVar3,auVar4);
  *(long *)(__return_storage_ptr__->m_elements + 0xc) = auVar4._0_8_;
  bVar1 = CONCAT31(in_register_00000031,directX) == 0;
  fVar2 = zNear;
  if (bVar1) {
    fVar2 = zNear + zFar;
  }
  if (!bVar1) {
    fVar5 = 1.0;
  }
  __return_storage_ptr__->m_elements[10] = fVar5 / (zNear - zFar);
  __return_storage_ptr__->m_elements[0xe] = fVar2 / (zNear - zFar);
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::orthographicProjection( float left, float right, float bottom, float top, float zNear, float zFar, bool directX )
{
	Matrix4f m;

	m( 0, 0 ) = 2.0f / ( right - left );
	m( 1, 1 ) = 2.0f / ( top - bottom );
	m( 3, 3 ) = 1.0f;

	m( 0, 3 ) = ( left + right ) / ( left - right );
	m( 1, 3 ) = ( top + bottom ) / ( bottom - top );

	if( directX )
	{
		m( 2, 2 ) = 1.0f / ( zNear - zFar );
		m( 2, 3 ) = zNear / ( zNear - zFar );
	}
	else
	{
		m( 2, 2 ) = 2.0f / ( zNear - zFar );
		m( 2, 3 ) = ( zNear + zFar ) / ( zNear - zFar );
	}

	return m;
}